

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_1_param_term(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children1(&G->data,PVIP_NODE_VARGS,G->val[-1]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_1_param_term(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define v G->val[-1]
  yyprintf((stderr, "do yy_1_param_term"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = CHILDREN1(PVIP_NODE_VARGS, v); }\n"));
  yy = CHILDREN1(PVIP_NODE_VARGS, v); ;
#undef v
}